

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<Tint>::vec(vec<Tint> *this,uint _sz,Tint *pad)

{
  int iVar1;
  undefined1 auVar2 [16];
  Tint *pTVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long lVar9;
  
  this->sz = _sz;
  this->cap = _sz;
  if (_sz == 0) {
    pTVar3 = (Tint *)0x0;
  }
  else {
    pTVar3 = (Tint *)malloc((ulong)_sz << 2);
  }
  this->data = pTVar3;
  auVar2 = _DAT_001d7970;
  if (this->sz != 0) {
    iVar1 = pad->v;
    uVar4 = (ulong)(this->sz + (uint)(this->sz == 0));
    lVar9 = uVar4 - 1;
    auVar6._8_4_ = (int)lVar9;
    auVar6._0_8_ = lVar9;
    auVar6._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_001d7970;
    auVar8 = _DAT_001db190;
    auVar10 = _DAT_001d7960;
    do {
      auVar11 = auVar10 ^ auVar2;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar7 && auVar6._0_4_ < auVar11._0_4_ || iVar7 < auVar11._4_4_)
                & 1)) {
        *(int *)((long)&pTVar3->v + uVar5) = iVar1;
      }
      if ((auVar11._12_4_ != auVar6._12_4_ || auVar11._8_4_ <= auVar6._8_4_) &&
          auVar11._12_4_ <= auVar6._12_4_) {
        *(int *)((long)&pTVar3[1].v + uVar5) = iVar1;
      }
      auVar11 = auVar8 ^ auVar2;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar7 && (iVar12 != iVar7 || auVar11._0_4_ <= auVar6._0_4_)) {
        *(int *)((long)&pTVar3[2].v + uVar5) = iVar1;
        *(int *)((long)&pTVar3[3].v + uVar5) = iVar1;
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar9 + 4;
      uVar5 = uVar5 + 0x10;
    } while ((uVar4 * 4 + 0xc & 0xfffffffffffffff0) != uVar5);
  }
  return;
}

Assistant:

vec(unsigned int _sz, const T& pad) : sz(_sz), cap(sz) {
		data = sz != 0 ? (T*)malloc(cap * sizeof(T)) : nullptr;
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(pad);
		}
	}